

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::NewInitialized
          (ScriptContext *scriptContext,SimplePropertyDescriptor *propertyDescriptors,
          int propertyCount,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,bool isLocked,
          bool isShared)

{
  Recycler *alloc;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this;
  undefined6 in_register_00000082;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._34_6_ = in_register_00000082;
  data.line._0_2_ = offsetOfInlineSlots;
  PropertyIndexRangesBase<Js::PropertyIndexRanges<int>_>::VerifySlotCapacity(propertyCount);
  local_68 = (undefined1  [8])
             &SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ee0091;
  data.filename._0_4_ = 0x102;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
  this = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
         new<Memory::Recycler>(0x30,alloc,0x387914);
  SimpleDictionaryTypeHandlerBase
            (this,scriptContext,propertyDescriptors,propertyCount,propertyCount,inlineSlotCapacity,
             (uint16)data.line,isLocked,isShared,true);
  return this;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> * SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::NewInitialized(ScriptContext * scriptContext, SimplePropertyDescriptor const* propertyDescriptors, int propertyCount, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared)
    {
        PropertyIndexRangesType::VerifySlotCapacity(propertyCount);
        return RecyclerNew(scriptContext->GetRecycler(), SimpleDictionaryTypeHandlerBase, scriptContext, propertyDescriptors, propertyCount, propertyCount, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared, true);
    }